

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_invalid_opc.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::ReplaceInvalidOpcodePass::GetSpecialConstant
          (ReplaceInvalidOpcodePass *this,uint32_t type_id)

{
  uint32_t uVar1;
  ConstantManager *this_00;
  DefUseManager *this_01;
  Instruction *pIVar2;
  Type *type;
  Constant *c;
  uint32_t i;
  uint uVar3;
  uint32_t component_const;
  TypeManager *local_58;
  ConstantManager *local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> literal_words;
  
  this_00 = IRContext::get_constant_mgr((this->super_Pass).context_);
  local_58 = IRContext::get_type_mgr((this->super_Pass).context_);
  this_01 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  pIVar2 = analysis::DefUseManager::GetDef(this_01,type_id);
  if (pIVar2->opcode_ - OpTypeInt < 2) {
    literal_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    literal_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    literal_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar3 = 0;
    while( true ) {
      uVar1 = Instruction::GetSingleWordInOperand(pIVar2,0);
      if (uVar1 <= uVar3) break;
      component_const = 0xdeadbeef;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&literal_words,&component_const);
      uVar3 = uVar3 + 0x20;
    }
    type = analysis::TypeManager::GetType(local_58,type_id);
  }
  else {
    local_50 = this_00;
    if (pIVar2->opcode_ != OpTypeVector) {
      __assert_fail("type->opcode() == spv::Op::OpTypeInt || type->opcode() == spv::Op::OpTypeFloat"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_invalid_opc.cpp"
                    ,0xc5,
                    "uint32_t spvtools::opt::ReplaceInvalidOpcodePass::GetSpecialConstant(uint32_t)"
                   );
    }
    uVar3 = 0;
    uVar1 = Instruction::GetSingleWordInOperand(pIVar2,0);
    component_const = GetSpecialConstant(this,uVar1);
    literal_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    literal_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    literal_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while( true ) {
      uVar1 = Instruction::GetSingleWordInOperand(pIVar2,1);
      if (uVar1 <= uVar3) break;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&literal_words,&component_const);
      uVar3 = uVar3 + 1;
    }
    type = analysis::TypeManager::GetType(local_58,type_id);
    this_00 = local_50;
  }
  c = analysis::ConstantManager::GetConstant
                (this_00,type,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &literal_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&literal_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  if (c != (Constant *)0x0) {
    pIVar2 = analysis::ConstantManager::GetDefiningInstruction(this_00,c,0,(inst_iterator *)0x0);
    uVar1 = Instruction::result_id(pIVar2);
    return uVar1;
  }
  __assert_fail("special_const != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_invalid_opc.cpp"
                ,0xcd,
                "uint32_t spvtools::opt::ReplaceInvalidOpcodePass::GetSpecialConstant(uint32_t)");
}

Assistant:

uint32_t ReplaceInvalidOpcodePass::GetSpecialConstant(uint32_t type_id) {
  const analysis::Constant* special_const = nullptr;
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();

  Instruction* type = context()->get_def_use_mgr()->GetDef(type_id);
  if (type->opcode() == spv::Op::OpTypeVector) {
    uint32_t component_const =
        GetSpecialConstant(type->GetSingleWordInOperand(0));
    std::vector<uint32_t> ids;
    for (uint32_t i = 0; i < type->GetSingleWordInOperand(1); ++i) {
      ids.push_back(component_const);
    }
    special_const = const_mgr->GetConstant(type_mgr->GetType(type_id), ids);
  } else {
    assert(type->opcode() == spv::Op::OpTypeInt ||
           type->opcode() == spv::Op::OpTypeFloat);
    std::vector<uint32_t> literal_words;
    for (uint32_t i = 0; i < type->GetSingleWordInOperand(0); i += 32) {
      literal_words.push_back(0xDEADBEEF);
    }
    special_const =
        const_mgr->GetConstant(type_mgr->GetType(type_id), literal_words);
  }
  assert(special_const != nullptr);
  return const_mgr->GetDefiningInstruction(special_const)->result_id();
}